

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

uint GetQuadCreaseEigenvalues(uint N,uint R,double *eigenvalues)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  
  if (1 < N) {
    if (GetQuadCreaseEigenvalues::e_sizeof[N - 2] >> 3 == (ulong)R) {
      if (R == 0) {
        return 0;
      }
      pdVar3 = GetQuadCreaseEigenvalues::e[N - 2];
      pdVar1 = pdVar3 + R;
      do {
        dVar2 = *pdVar3;
        pdVar3 = pdVar3 + 1;
        *eigenvalues = dVar2;
        eigenvalues = eigenvalues + 1;
      } while (pdVar3 < pdVar1);
      return R;
    }
  }
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

static unsigned int GetQuadCreaseEigenvalues(
  unsigned int N,
  unsigned int R,
  double* eigenvalues
)
{
  static const double e2[4] = 
  {1.0, 0.5, 0.25, 0.25};
  static const double e3[6] = 
  {1.0, 0.5, 0.5, 0.25, 0.25, 0.125};
  static const double e4[8] = 
  {1.0, 0.5, 0.5, 0.3475970508005518921819191, 0.25, 0.25,
  0.08990294919944810781808094, 0.0625};
  static const double e5[10] = 
  {1.0, 0.5, 0.5, 0.4027739218546748178592416, 0.2985112089851678742713826, 0.25,
  0.25, 0.06132374806987680407830079, 0.04544938284868830104054729,
  0.03661165235168155944989445};
  static const double e6[12] = 
  {1.0, 0.5, 0.5, 0.4338607343486338835457207, 0.3500160863488253415435189,
  0.2788059129733551205593399, 0.25, 0.25, 0.0428127141360395954023001,
  0.0341025407605693744181211, 0.02751214135449768844149263,
  0.02387287570313157198721332};
  static const double e7[14] = 
  {1.0, 0.5, 0.5, 0.4524883960194854484584697, 0.3868484484678842764124981,
  0.3198112959966680476694149, 0.269127266963170621672735, 0.25, 0.25,
  0.03111320661766488579086877, 0.02618235305722229063965432,
  0.02164520058600606189657112, 0.01850525303440488985059954,
  0.0167468245269451691545346};
  static const double e8[16] = 
  {1.0, 0.5, 0.5, 0.4643651755137316635248271,
  0.4125707561012937086818205,
  0.3544821369293089604984253,
  0.3012775591854784677914885,
  0.2636617247210804425225423, 0.25, 0.25,
  0.02347494981551238513891938,
  0.02054399860657505933386027,
  0.01746052935054695740643632,
  0.01500214366764081029526673,
  0.01332883274300524623177295,
  0.01237889151219760922048721};
  static const double e9[18] = 
  {1.0, 0.5, 0.5, 0.4723463441863384015192462,
  0.4308226511075866703470591,
  0.3815615404738973077099547,
  0.3318586781599466572198922,
  0.2891905790294515501929928,
  0.2602656637115420192311205, 0.25, 0.25,
  0.01827951159672544722081085,
  0.01645119019440832022485581,
  0.01433600966659543228200454,
  0.01246857639828100325799948,
  0.01104289481022786208695261,
  0.01007212033415834999881356,
  0.009515058436089155483977101};
  static const double e10[20] = 
  {1.0, 0.5, 0.5, 0.4779461323788179580284805,
  0.4440893381762303346169582,
  0.4024164222230339077518639,
  0.3578375190704969729339551,
  0.3156351744644154185583903,
  0.2809030992590270743668487,
  0.2580062768878958596628428, 0.25, 0.25,
  0.0146089903173884963168662,
  0.01341819015462357521932491,
  0.0119416703391074854280824,
  0.01053330352465963744605301,
  0.009366444788855289841073367,
  0.008487506627292569369514451,
  0.00788626781457720035829123,
  0.00753842240176145199323634};
  static const double e11[22] = 
  {1.0, 0.5, 0.5, 0.4820168104737422559487429, 0.453970779385004836126948,
  0.4185545871310304361025496, 0.3791682984415772365648197,
  0.3396012178854845423282521, 0.3036900507512289303420477,
  0.2749846048497542572933016, 0.256424494661140823867932, 0.25, 0.25,
  0.01192931172817658658840325, 0.0111241417795889216648019,
  0.01007266363842353548275418, 0.009007528743858636629851362,
  0.0080675724846343704060705, 0.007308408092049598881127255,
  0.00673824807776591199003043, 0.006346184749337779034933979,
  0.006117935463105803485445083};
  static const double e12[24] = 
  {1.0, 0.5, 0.5, 0.4850641610369383823975897,
  0.4614985474347087619667882,
  0.4311821255710073423107508,
  0.3965315266016385362937548,
  0.3603110020217894833299555,
  0.3254201240117244451121387,
  0.2946777837281643548152523,
  0.270614738818649360997862,
  0.2552725419984611848187261, 0.25, 0.25,
  0.009917592896102293972385845,
  0.009355326173828645421819572,
  0.008591381125050664705040022,
  0.007779755959415404224109989,
  0.007026399790425526641978355,
  0.006384584778897758789127306,
  0.00587150765060411340781648,
  0.005485800904827523567735387,
  0.005219287163334916237544707,
  0.005063378298187826263703993};
  static const double e13[26] = 
  {1.0, 0.5, 0.5, 0.4874023599648010128335877, 0.4673500587464579739048183,
  0.4411915336267357444040795, 0.4106853584910705583143491,
  0.3778828393545584232161755, 0.3449931832638130534338588,
  0.3142414753967076886176823, 0.2877286532750699869095651,
  0.2672980989570970429233383, 0.2544068297436071576795717, 0.25, 0.25,
  0.008370985397992234789274648, 0.007967268997581054543760475,
  0.007401542504344500852893572, 0.006777068031025239694881906,
  0.006172979526104779585092999, 0.005635704073174505096388671,
  0.005185565574477465291827455, 0.00482700980099718390848469,
  0.004556832329593394957851468, 0.004369358935986746324441877,
  0.0042592717138664641562821};
  static const double e14[28] = 
  {1.0, 0.5, 0.5, 0.4892343474885726073240006,
  0.4719804834258717874763822,
  0.4492298614073128369092644,
  0.42228946574606179458229,
  0.3927069701810019940266986,
  0.362183044731843177171771,
  0.3324764840394177067868378,
  0.3053079120274184419879482,
  0.2822665844803848275730051,
  0.2647220004036752431982968,
  0.2537393296624997399764198, 0.25, 0.25,
  0.00715748880273074983971188,
  0.00686054203316051302491066,
  0.006434117641714528308420467,
  0.005948540274674075908830307,
  0.005462450723752333177711865,
  0.005014415879728434370349952,
  0.004624660494400380852689325,
  0.004300690777742151874669176,
  0.004042777577568631615465928,
  0.003847905739002843063701085,
  0.003712201361565622874300741,
  0.003632272821743496605377215};
  static const double e15[30] = 
  {1.0, 0.5, 0.5, 0.4906956940465353267709958,
  0.4757028727019528632086783,
  0.455766067824132773843117,
  0.4318751128950106685349497,
  0.4052160522897933526263431,
  0.3771127514616678985622512,
  0.3489624347972032671084194,
  0.322168625035827813472657,
  0.2980747069657881557286016,
  0.2779003551379126765050381,
  0.2626814932568613771801873,
  0.2532135590826550284758983, 0.25, 0.25,
  0.00618847384916111889230231,
  0.005965420209880330285766977,
  0.005638731508127695651873455,
  0.005257089756414251201239889,
  0.004863929529021519713339058,
  0.004490470412801530600934818,
  0.004155270492876199683215923,
  0.003867086409290046155236813,
  0.003628376449228194769988451,
  0.003438179362753015717975701,
  0.00329408456109496112534435,
  0.003193436395811162253984047,
  0.00313401097727204912273354};
  static const double e16[32] = 
  {1.0, 0.5, 0.5, 0.4918796373911240560348713,
  0.4787373551247809344061374,
  0.4611427069644219962279705,
  0.4398580642032740903608299,
  0.4158055761130113066382872,
  0.390027416834009389044947,
  0.3636412108488202632024345,
  0.3377927419491292896466998,
  0.3136080620499505782036071,
  0.292146813032174258103034,
  0.274357897741047252333337,
  0.2610378215649526154634098,
  0.2527918855047203998444193, 0.25, 0.25,
  0.005402764220102485932368158,
  0.005232096046270863116682577,
  0.004978077778632910171734617,
  0.004674960989517055686540183,
  0.004355037766598012314251226,
  0.00404323357055087285837187,
  0.003755831059271643390444508,
  0.003501740890995885397890572,
  0.003284648000405711892357816,
  0.003105035613274500157028433,
  0.002961718646983871018171953,
  0.002852868988636084124507635,
  0.002776644630749646420752988,
  0.002731549908274295258929157};
  static const double e17[34] = 
  {1.0, 0.5, 0.5, 0.4928519465484388397628774,
  0.4812419214171066989423527,
  0.4656128029920844325827301,
  0.4465606941843988484692585,
  0.424812165480439064558305,
  0.4011966249932869370793232,
  0.3766149590426153432153104,
  0.3520057408143481537617202,
  0.3283103707443307886219883,
  0.3064384408280979168009157,
  0.2872343561627713321664122,
  0.2714458174511992239759956,
  0.2596943795921930616164232,
  0.2524484295514478534381793, 0.25, 0.25,
  0.004757090297340728139502408,
  0.004624358743088481586008327,
  0.004424160910175009107610274,
  0.004180976088102615001936721,
  0.003918959943644192824684854,
  0.00365788010922537763040869,
  0.003411648832828200475698599,
  0.003188720856577044503144021,
  0.002993345157921484120166864,
  0.002826943464389544626206934,
  0.002689264842243817342049787,
  0.002579224555426395685829897,
  0.00249546001990384341095027,
  0.002436674914664392471599904,
  0.00240183994959619385922722};
  static const double e18[36] = 
  {1.0, 0.5, 0.5, 0.4936600572298639301751713,
  0.4833321071081027545791269,
  0.4693655637489887341991605,
  0.4522328837092091861166156,
  0.4325135619763201089802969,
  0.4108745595057475305920414,
  0.3880478731496155426360755,
  0.3648060650769540190542029,
  0.3419366335423175665278088,
  0.320216108508285892492672,
  0.3003846672037622620284949,
  0.2831218712479197365270371,
  0.2690238699263027046806524,
  0.2585822504755439455599121,
  0.2521649077398439413425099, 0.25, 0.25,
  0.004220179878692891801759286,
  0.004115445927936134297961187,
  0.003955713186520081732092417,
  0.003758739178522429411908854,
  0.003542728327855244753694386,
  0.003323322098671379512283609,
  0.003112217777696630959319223,
  0.002917115069157786970353485,
  0.002742396862321762198393639,
  0.00259003933228738277985616,
  0.002460457574771729873773056,
  0.002353170917222417960220722,
  0.002267275982618210720919093,
  0.002201759937123569867153837,
  0.002155696524705100825980994,
  0.002128362539512277714756394};
  static const double e19[38] = 
  {1.0, 0.5, 0.5, 0.494338860883546070532964,
  0.4850938522059087731405798,
  0.4725442488309184925419464,
  0.457069112822645281805701,
  0.4391358254141653594145081,
  0.4192859786862247557426383,
  0.3981190803632466700566333,
  0.376274597652746018210246,
  0.3544129175605437659005613,
  0.333195821913103737936705,
  0.3132670521652698526535814,
  0.2952334593627969724433445,
  0.2796471003777019238459064,
  0.2669884954445580774594627,
  0.2576512096332567606306801,
  0.2519280988436448268724412, 0.25, 0.25,
  0.003768993776777150865030121,
  0.003685274515452676520870507,
  0.003556390829335076853386117,
  0.003395405979373806912108798,
  0.003216151173333596924639297,
  0.003031009581678132504732807,
  0.002849721918135655591096795,
  0.002679121978037925651288328,
  0.002523464094201966948068253,
  0.002385003592067608708145546,
  0.002264600976431821046188419,
  0.002162236332782625743806115,
  0.002077400135120119142943681,
  0.002009368305901747016666927,
  0.0019573850140940428631998,
  0.001920778461640462632113888,
  0.001899030873473992579157122};
  static const double e20[40] = 
  {1.0, 0.5, 0.5, 0.4949144741229649487947415,
  0.4865920796256587990369664,
  0.4752586491350964339113918,
  0.4612216953194131189045514,
  0.4448620526473305969505388,
  0.4266235443444738895244926,
  0.4070009705959143560203706,
  0.3865267637057714686536609,
  0.3657566942813565517893462,
  0.34525503501672240530079,
  0.3255795888907262134327553,
  0.3072669591378968612633435,
  0.2908183749503575990130514,
  0.2766862982234843174818616,
  0.2652619581329413087246701,
  0.2568639586300465015069328,
  0.251728246273788614145149, 0.25, 0.25,
  0.003386264950190495753910062,
  0.003318560306693570214981728,
  0.003213497115566963950845717,
  0.003080812251285889215138478,
  0.002931102745744173241052439,
  0.002774195246119185997058834,
  0.002618157176972010977012182,
  0.002468953239997107683296335,
  0.002330561683921314234983495,
  0.002205328627589478520754814,
  0.002094389446004944194288476,
  0.001998057886466699264485282,
  0.001916141267292168987804277,
  0.001848175283123922040090202,
  0.001793588688772172590353523,
  0.001751813424471741486263179,
  0.001722355238933792682089404,
  0.001704837074659703299686351};

  static const size_t e_sizeof[] = {
  sizeof(e2),
  sizeof(e3),
  sizeof(e4),
  sizeof(e5),
  sizeof(e6),
  sizeof(e7),
  sizeof(e8),
  sizeof(e9),
  sizeof(e10),
  sizeof(e11),
  sizeof(e12),
  sizeof(e13),
  sizeof(e14),
  sizeof(e15),
  sizeof(e16),
  sizeof(e17),
  sizeof(e18),
  sizeof(e19),
  sizeof(e20)
  };

  static const double* e[] = {
  e2,
  e3,
  e4,
  e5,
  e6,
  e7,
  e8,
  e9,
  e10,
  e11,
  e12,
  e13,
  e14,
  e15,
  e16,
  e17,
  e18,
  e19,
  e20
  };

  static size_t e_count = sizeof(e_sizeof) / sizeof(e_sizeof[0]);
  if (e_count != sizeof(e) / sizeof(e[0]))
    return ON_SUBD_RETURN_ERROR(0);

  if (N < 2)
    return ON_SUBD_RETURN_ERROR(0);
  unsigned int edex = N - 2;
  if (edex >= e_count)
    return ON_SUBD_RETURN_ERROR(0);
  if (R != e_sizeof[edex] / sizeof(double))
    return ON_SUBD_RETURN_ERROR(0);
  if (nullptr != eigenvalues)
  {
    const double* src = e[edex];
    const double* src1 = src + R;
    double* dst = eigenvalues;
    while (src < src1)
    {
      *dst++ = *src++;
    }
  }
  return R;
}